

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
llvm::
DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::allocateBuckets(DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                  *this,uint Num)

{
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar1;
  
  this->NumBuckets = Num;
  if (Num == 0) {
    pDVar1 = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0;
  }
  else {
    pDVar1 = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)operator_new((ulong)Num << 5,8);
  }
  this->Buckets = pDVar1;
  return Num != 0;
}

Assistant:

bool allocateBuckets(unsigned Num) {
    NumBuckets = Num;
    if (NumBuckets == 0) {
      Buckets = nullptr;
      return false;
    }

    Buckets = static_cast<BucketT *>(
        allocate_buffer(sizeof(BucketT) * NumBuckets, alignof(BucketT)));
    return true;
  }